

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CivetServer.cpp
# Opt level: O2

void __thiscall
CivetServer::CivetServer
          (CivetServer *this,char **options,CivetCallbacks *_callbacks,void *UserContextIn)

{
  _Rb_tree_header *p_Var1;
  mg_context *pmVar2;
  CivetException *this_00;
  _func_void_mg_connection_ptr *p_Var3;
  allocator local_219;
  string exceptionMsg;
  mg_error_data local_1f8;
  mg_init_data local_1e0;
  CivetCallbacks callbacks;
  char errtxtbuf [256];
  
  this->_vptr_CivetServer = (_func_int **)&PTR__CivetServer_001858f8;
  this->context = (mg_context *)0x0;
  p_Var1 = &(this->connections)._M_t._M_impl.super__Rb_tree_header;
  (this->connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->connections)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var3 = (_func_void_mg_connection_ptr *)0x0;
  memset(&callbacks.super_mg_callbacks,0,0x90);
  this->UserContext = UserContextIn;
  if (_callbacks != (CivetCallbacks *)0x0) {
    memcpy(&callbacks,_callbacks,0x90);
    p_Var3 = (_callbacks->super_mg_callbacks).connection_close;
  }
  this->userCloseHandler = p_Var3;
  callbacks.super_mg_callbacks.connection_close = closeHandler;
  local_1f8.code = 0;
  local_1f8.code_sub = 0;
  local_1e0.callbacks = &callbacks.super_mg_callbacks;
  local_1e0.user_data = this;
  local_1e0.configuration_options = options;
  memset(errtxtbuf,0,0x100);
  local_1f8.text_buffer_size = 0x100;
  local_1f8.text = errtxtbuf;
  pmVar2 = mg_start2(&local_1e0,&local_1f8);
  this->context = pmVar2;
  if (pmVar2 != (mg_context *)0x0) {
    return;
  }
  std::__cxx11::string::string
            ((string *)&exceptionMsg,
             "null context when constructing CivetServer. Possible problem binding to port. Error: "
             ,&local_219);
  std::__cxx11::string::append((char *)&exceptionMsg);
  this_00 = (CivetException *)__cxa_allocate_exception(0x10);
  CivetException::CivetException(this_00,&exceptionMsg);
  __cxa_throw(this_00,&CivetException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

CivetServer::CivetServer(const char **options,
                         const struct CivetCallbacks *_callbacks,
                         const void *UserContextIn)
    : context(0)
{
	struct CivetCallbacks callbacks;

	UserContext = UserContextIn;

	if (_callbacks) {
		callbacks = *_callbacks;
		userCloseHandler = _callbacks->connection_close;
	} else {
		userCloseHandler = NULL;
	}
	callbacks.connection_close = closeHandler;
	struct mg_init_data mg_start_init_data = {0};
	mg_start_init_data.callbacks = &callbacks;
	mg_start_init_data.user_data = this;
	mg_start_init_data.configuration_options = options;

	struct mg_error_data mg_start_error_data = {0};
	char errtxtbuf[256] = {0};
	mg_start_error_data.text = errtxtbuf;
	mg_start_error_data.text_buffer_size = sizeof(errtxtbuf);

	context = mg_start2(&mg_start_init_data, &mg_start_error_data);

	if (context == NULL) {
		std::string exceptionMsg =
		    "null context when constructing CivetServer. "
		    "Possible problem binding to port. Error: ";
		exceptionMsg += errtxtbuf;
		throw CivetException(exceptionMsg);
	}
}